

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

int __thiscall
ON_SimpleArray<const_ON_Font_*>::BinarySearch
          (ON_SimpleArray<const_ON_Font_*> *this,ON_Font **key,
          _func_int_ON_Font_ptr_ptr_ON_Font_ptr_ptr *compar)

{
  void *pvVar1;
  
  if (((key == (ON_Font **)0x0) || (this->m_a == (ON_Font **)0x0)) || ((long)this->m_count < 1)) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = bsearch(key,this->m_a,(long)this->m_count,8,(__compar_fn_t)compar);
  }
  return -(uint)(pvVar1 == (void *)0x0) | (uint)((ulong)((long)pvVar1 - (long)this->m_a) >> 3);
}

Assistant:

int ON_SimpleArray<T>::BinarySearch( const T* key, int (*compar)(const T*,const T*) ) const
{
  const T* found = (nullptr != key && nullptr != m_a && m_count>0)
                 ? (const T*)bsearch( key, m_a, m_count, sizeof(T), (int(*)(const void*,const void*))compar ) 
                 : nullptr;

  // This worked on a wide range of 32 bit compilers.

  int rc;
  if ( 0 != found )
  {
    // Convert "found" pointer to array index.

#if defined(ON_COMPILER_MSC1300)
    rc = ((int)(found - m_a));
#elif 8 == ON_SIZEOF_POINTER
    // In an ideal world, return ((int)(found - m_a)) would work everywhere.
    // In practice, this should work any 64 bit compiler and we can hope
    // the optimzer generates efficient code.
    const ON__UINT64 fptr = (ON__UINT64)found;
    const ON__UINT64 aptr = (ON__UINT64)m_a;
    const ON__UINT64 sz   = (ON__UINT64)sizeof(T);
    const ON__UINT64 i    = (fptr - aptr)/sz;
    rc = (int)i;
#else
    // In an ideal world, return ((int)(found - m_a)) would work everywhere.
    // In practice, this should work any 32 bit compiler and we can hope
    // the optimzer generates efficient code.
    const ON__UINT32 fptr = (ON__UINT32)found;
    const ON__UINT32 aptr = (ON__UINT32)m_a;
    const ON__UINT32 sz   = (ON__UINT32)sizeof(T);
    const ON__UINT32 i    = (fptr - aptr)/sz;
    rc = (int)i;
#endif
  }
  else
  {
    // "key" not found
    rc = -1;
  }

  return rc;

}